

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.cpp
# Opt level: O3

IShaderResourceVariable * __thiscall
Diligent::ShaderVariableManagerGL::GetVariable(ShaderVariableManagerGL *this,Uint32 Index)

{
  UniformBuffBindInfo *pUVar1;
  TextureBindInfo *pTVar2;
  ImageBindInfo *pIVar3;
  StorageBufferBindInfo *pSVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint local_4;
  
  uVar5 = this->m_TextureOffset / 0x18;
  uVar6 = Index - uVar5;
  if (Index < uVar5) {
    pUVar1 = GetResource<Diligent::ShaderVariableManagerGL::UniformBuffBindInfo>(this,Index);
    return (IShaderResourceVariable *)pUVar1;
  }
  uVar7 = (uint)(((ulong)this->m_ImageOffset - (ulong)this->m_TextureOffset) / 0x18);
  uVar5 = uVar6 - uVar7;
  if (uVar6 < uVar7) {
    pTVar2 = GetResource<Diligent::ShaderVariableManagerGL::TextureBindInfo>(this,uVar6);
    return (IShaderResourceVariable *)pTVar2;
  }
  uVar6 = (uint)(((ulong)this->m_StorageBufferOffset - (ulong)this->m_ImageOffset) / 0x18);
  uVar7 = uVar5 - uVar6;
  if (uVar5 < uVar6) {
    pIVar3 = GetResource<Diligent::ShaderVariableManagerGL::ImageBindInfo>(this,uVar5);
    return (IShaderResourceVariable *)pIVar3;
  }
  if (uVar7 < (uint)(((ulong)this->m_VariableEndOffset - (ulong)this->m_StorageBufferOffset) / 0x18)
     ) {
    pSVar4 = GetResource<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>(this,uVar7);
    return (IShaderResourceVariable *)pSVar4;
  }
  LogError<false,unsigned_int,char[32]>
            (false,"GetVariable",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
             ,0x20f,&local_4,(char (*) [32])" is not a valid variable index.");
  return (IShaderResourceVariable *)0x0;
}

Assistant:

IShaderResourceVariable* ShaderVariableManagerGL::GetVariable(Uint32 Index) const
{
    ShaderVariableLocator VarLocator(*this, Index);

    if (auto* pUB = VarLocator.TryResource<UniformBuffBindInfo>(GetNumUBs()))
        return pUB;

    if (auto* pTexture = VarLocator.TryResource<TextureBindInfo>(GetNumTextures()))
        return pTexture;

    if (auto* pImage = VarLocator.TryResource<ImageBindInfo>(GetNumImages()))
        return pImage;

    if (auto* pSSBO = VarLocator.TryResource<StorageBufferBindInfo>(GetNumStorageBuffers()))
        return pSSBO;

    LOG_ERROR(Index, " is not a valid variable index.");
    return nullptr;
}